

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  int iVar3;
  SocketAddress *pSVar4;
  void *pvVar5;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var6;
  undefined4 in_register_00000084;
  DatagramPortImpl *pDVar7;
  Fault f;
  OwnPromiseNode intermediate;
  OwnPromiseNode local_80;
  PromiseArena *local_78;
  Disposer *local_70;
  DatagramPort local_68;
  NetworkAddressImpl *local_60;
  DatagramPortImpl *local_58;
  OwnPromiseNode local_50;
  undefined1 local_48 [24];
  
  local_60 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  pp_Var6 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  local_78 = (PromiseArena *)__buf;
  local_70 = (Disposer *)__n;
  local_58 = this;
  pSVar4 = NetworkAddressImpl::chooseOneAddress(local_60);
  do {
    iVar3 = 0;
    local_48._0_8_ =
         sendto(*(int *)(pp_Var6 + 1),local_78,(size_t)local_70,0,
                (sockaddr *)&(pSVar4->addr).generic,pSVar4->addrlen);
    if (-1 < (long)local_48._0_8_) break;
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
    if ((long)local_48._0_8_ < 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_80);
      OVar2.ptr = local_80.ptr;
      pPVar1 = (PromiseArena *)
               ((SleepHooks *)&((local_80.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_80.ptr - (long)pPVar1) < 0x40) {
        pvVar5 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_80,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
                   ::anon_class_32_3_b2634f1b_for_func::operator());
        *(undefined ***)((long)pvVar5 + 0x3c0) = &PTR_destroy_0064a468;
        *(_func_int ***)((long)pvVar5 + 0x3e0) = pp_Var6;
        *(PromiseArena **)((long)pvVar5 + 1000) = local_78;
        *(Disposer **)((long)pvVar5 + 0x3f0) = local_70;
        *(NetworkAddressImpl **)((long)pvVar5 + 0x3f8) = local_60;
        *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
      }
      else {
        ((SleepHooks *)&((local_80.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
             (_func_int **)0x0;
        this_00 = (TransformPromiseNodeBase *)(local_80.ptr + -4);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_80,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
                   ::anon_class_32_3_b2634f1b_for_func::operator());
        OVar2.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
             (_func_int **)&PTR_destroy_0064a468;
        OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var6;
        OVar2.ptr[-2].super_PromiseArenaMember.arena = local_78;
        OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)local_70;
        OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_60;
        OVar2.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
      }
      local_48._0_8_ = &DAT_004a8171;
      local_48._8_8_ = &DAT_004a81d0;
      local_48._16_8_ = &DAT_4c0000058b;
      local_50.ptr = &this_00->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_68,&local_50,(SourceLocation *)local_48);
      OVar2.ptr = local_50.ptr;
      pDVar7 = local_58;
      (local_58->super_DatagramPort)._vptr_DatagramPort = local_68._vptr_DatagramPort;
      if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
        local_50.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      OVar2.ptr = local_80.ptr;
      if ((UnixEventPort *)local_80.ptr != (UnixEventPort *)0x0) {
        local_80.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
    }
    else {
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)&local_68,(unsigned_long *)local_48);
      (local_58->super_DatagramPort)._vptr_DatagramPort = local_68._vptr_DatagramPort;
      pDVar7 = local_58;
    }
    return (ssize_t)pDVar7;
  }
  local_68._vptr_DatagramPort = (_func_int **)0x0;
  local_48._0_8_ = (PromiseFulfiller<void> *)0x0;
  local_48._8_8_ = (Disposer *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_68,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_68);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const byte> buffer, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, &destination]() {
      return send(buffer, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}